

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int wally_map_init_alloc(size_t allocation_len,wally_map **output)

{
  int iVar1;
  wally_map *output_00;
  
  if (output == (wally_map **)0x0) {
    iVar1 = -2;
  }
  else {
    *output = (wally_map *)0x0;
    output_00 = (wally_map *)wally_calloc(0x18);
    *output = output_00;
    if (output_00 == (wally_map *)0x0) {
      iVar1 = -3;
    }
    else {
      iVar1 = wally_map_init(allocation_len,output_00);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        wally_free(output_00);
        *output = (wally_map *)0x0;
      }
    }
  }
  return iVar1;
}

Assistant:

int wally_map_init_alloc(size_t allocation_len, struct wally_map **output)
{
    struct wally_map *result;
    int ret;

    TX_CHECK_OUTPUT;
    TX_OUTPUT_ALLOC(struct wally_map);

    ret = wally_map_init(allocation_len, result);
    if (ret != WALLY_OK) {
        wally_free(result);
        *output = NULL;
    }
    return ret;
}